

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O2

int GetMsgSeanet(SEANET *pSeanet,int mid,uchar *databuf,int databuflen,int *pNbdatabytes)

{
  uchar *__dest;
  int iVar1;
  int iVar2;
  int iVar3;
  char *__s;
  long lVar4;
  double dVar5;
  int len;
  int remainingdatalen;
  int local_8a4;
  uchar *ptr;
  int *local_898;
  uchar *local_890;
  uchar *remainingdata;
  CHRONO chrono;
  uchar recvbuf [2048];
  
  ptr = (uchar *)0x0;
  len = 0;
  remainingdata = (uchar *)0x0;
  remainingdatalen = 0;
  StartChrono(&chrono);
  memset(recvbuf,0,0x800);
  iVar1 = ReadAllRS232Port(&pSeanet->RS232Port,recvbuf,0xb);
  if (iVar1 != 0) {
    puts("Error reading data from a Seanet. ");
    return 1;
  }
  lVar4 = 0;
  iVar1 = 1;
  local_8a4 = databuflen;
  local_898 = pNbdatabytes;
  local_890 = databuf;
  while (iVar2 = AnalyseBufHdrHexBinLenMIDSeanet(recvbuf + lVar4,0xb,mid,&len), iVar2 != 0) {
    dVar5 = GetTimeElapsedChronoQuick(&chrono);
    if (4.0 < dVar5) {
      puts("Error reading data from a Seanet : Message timeout. ");
      return 2;
    }
    if (lVar4 == 0x7f4) goto LAB_0017328a;
    iVar2 = ReadAllRS232Port(&pSeanet->RS232Port,recvbuf + lVar4 + 0xb,1);
    if (iVar2 != 0) goto LAB_00173232;
    lVar4 = lVar4 + 1;
  }
  iVar2 = (int)lVar4;
  if (len + iVar2 < 0x800) {
    if (len < 0xc) {
      iVar2 = iVar2 + 0xb;
LAB_0017325b:
      iVar2 = FindLatestMsgWithMIDSeanet
                        (recvbuf,iVar2,mid,&ptr,&len,&remainingdata,&remainingdatalen);
      if (iVar2 != 0) goto LAB_0017328a;
      if (0 < remainingdatalen) {
        puts("Error getting data from a Seanet : Unexpected data after a message. ");
      }
      __dest = local_890;
      iVar2 = local_8a4;
      memset(local_890,0,(long)local_8a4);
      *local_898 = len;
      if (len <= iVar2) {
        if (0 < len) {
          memcpy(__dest,ptr,(ulong)(uint)len);
        }
        return 0;
      }
      __s = "Error getting data from a Seanet : Too small data buffer. ";
    }
    else {
      iVar3 = ReadAllRS232Port(&pSeanet->RS232Port,recvbuf + lVar4 + 0xb,len + -0xb);
      if (iVar3 == 0) {
        iVar2 = iVar2 + len;
        goto LAB_0017325b;
      }
LAB_00173232:
      __s = "Error reading data from a Seanet. ";
    }
    puts(__s);
  }
  else {
LAB_0017328a:
    puts("Error reading data from a Seanet : Invalid data. ");
    iVar1 = 4;
  }
  return iVar1;
}

Assistant:

inline int GetMsgSeanet(SEANET* pSeanet, int mid, unsigned char* databuf, int databuflen, int* pNbdatabytes)
{
	unsigned char recvbuf[MAX_NB_BYTES_SEANET];
	int i = 0;
	int BytesReceived = 0, recvbuflen = 0;
	unsigned char* ptr = NULL;
	int len = 0;
	unsigned char* remainingdata = NULL;
	int remainingdatalen = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_SEANET-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired message...

	if (ReadAllRS232Port(&pSeanet->RS232Port, recvbuf, MIN_MESSAGE_LEN_SEANET) != EXIT_SUCCESS)
	{
		printf("Error reading data from a Seanet. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += MIN_MESSAGE_LEN_SEANET;

	i = 0;
	while (AnalyseBufHdrHexBinLenMIDSeanet(recvbuf+i, BytesReceived-i, mid, &len) != EXIT_SUCCESS)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_SEANET)
		{
			printf("Error reading data from a Seanet : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		if (BytesReceived+1 > recvbuflen)
		{
			printf("Error reading data from a Seanet : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pSeanet->RS232Port, recvbuf+BytesReceived, 1) != EXIT_SUCCESS)
		{
			printf("Error reading data from a Seanet. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += 1;
		i++;
	}

	// Notes :
	// BytesReceived+len-(BytesReceived-i) = len+i
	// BytesReceived = MIN_MESSAGE_LEN_SEANET+i
	// len-MIN_MESSAGE_LEN_SEANET = len-(BytesReceived-i)
	if (len+i > recvbuflen)
	{
		printf("Error reading data from a Seanet : Invalid data. \n");
		return EXIT_INVALID_DATA;
	}

	// Read the remaining bytes of the message according to the length found.
	if (len-(BytesReceived-i) > 0)
	{
		if (ReadAllRS232Port(&pSeanet->RS232Port, recvbuf+BytesReceived, len-(BytesReceived-i)) != EXIT_SUCCESS)
		{
			printf("Error reading data from a Seanet. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += (len-(BytesReceived-i));
	}

	if (FindLatestMsgWithMIDSeanet(recvbuf, BytesReceived, mid, 
		&ptr, &len, &remainingdata, &remainingdatalen) != EXIT_SUCCESS)
	{
		printf("Error reading data from a Seanet : Invalid data. \n");
		return EXIT_INVALID_DATA;
	}

	if (remainingdatalen > 0)
	{
		printf("Error getting data from a Seanet : Unexpected data after a message. \n");
	}

	// Get data bytes.

	memset(databuf, 0, databuflen);
	*pNbdatabytes = len;

	// Check the number of data bytes before copy.
	if (databuflen < *pNbdatabytes)
	{
		printf("Error getting data from a Seanet : Too small data buffer. \n");
		return EXIT_FAILURE;
	}

	// Copy the data bytes of the message.
	if (*pNbdatabytes > 0)
	{
		memcpy(databuf, ptr, *pNbdatabytes);
	}

	return EXIT_SUCCESS;
}